

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O0

int snprintf_can_error_frame(char *buf,size_t len,canfd_frame *cf,char *sep)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *in_RCX;
  uint *in_RDX;
  long in_RSI;
  undefined1 *in_RDI;
  int tmp_n;
  char *defsep;
  int classes;
  int n;
  int i;
  canid_t mask;
  canid_t class;
  canfd_frame *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  char *buf_00;
  int local_3c;
  int local_38;
  int local_34;
  char *local_28;
  int local_4;
  
  local_38 = 0;
  local_3c = 0;
  buf_00 = ",";
  if ((*in_RDX & 0x20000000) == 0) {
    local_4 = 0;
  }
  else {
    uVar1 = *in_RDX & 0x1fffffff;
    if (uVar1 < 0x401) {
      local_28 = in_RCX;
      if (in_RCX == (char *)0x0) {
        local_28 = ",";
      }
      for (local_34 = 0; local_34 < 10; local_34 = local_34 + 1) {
        uVar2 = 1 << ((byte)local_34 & 0x1f);
        if ((uVar1 & uVar2) != 0) {
          if (local_3c != 0) {
            iVar3 = snprintf(in_RDI + local_38,in_RSI - local_38,"%s",local_28);
            if ((iVar3 < 0) || ((ulong)(in_RSI - local_38) <= (ulong)(long)iVar3)) {
              *in_RDI = 0;
              return 0;
            }
            local_38 = iVar3 + local_38;
          }
          in_stack_ffffffffffffffb4 =
               snprintf(in_RDI + local_38,in_RSI - local_38,"%s",error_classes[local_34]);
          if ((in_stack_ffffffffffffffb4 < 0) ||
             ((ulong)(in_RSI - local_38) <= (ulong)(long)in_stack_ffffffffffffffb4)) {
            *in_RDI = 0;
            return 0;
          }
          local_38 = in_stack_ffffffffffffffb4 + local_38;
          if (uVar2 == 2) {
            iVar3 = snprintf_error_lostarb
                              (buf_00,CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                               in_stack_ffffffffffffffa8);
            local_38 = iVar3 + local_38;
          }
          if (uVar2 == 4) {
            iVar3 = snprintf_error_ctrl(buf_00,CONCAT44(in_stack_ffffffffffffffb4,
                                                        in_stack_ffffffffffffffb0),
                                        in_stack_ffffffffffffffa8);
            local_38 = iVar3 + local_38;
          }
          if (uVar2 == 8) {
            iVar3 = snprintf_error_prot(buf_00,CONCAT44(in_stack_ffffffffffffffb4,
                                                        in_stack_ffffffffffffffb0),
                                        in_stack_ffffffffffffffa8);
            local_38 = iVar3 + local_38;
          }
          if (uVar2 == 0x200) {
            iVar3 = snprintf_error_cnt(buf_00,CONCAT44(in_stack_ffffffffffffffb4,
                                                       in_stack_ffffffffffffffb0),
                                       in_stack_ffffffffffffffa8);
            local_38 = iVar3 + local_38;
          }
          local_3c = local_3c + 1;
        }
      }
      if (((*in_RDX & 0x200) == 0) &&
         ((*(char *)((long)in_RDX + 0xe) != '\0' || (*(char *)((long)in_RDX + 0xf) != '\0')))) {
        iVar3 = snprintf(in_RDI + local_38,in_RSI - local_38,"%serror-counter-tx-rx",local_28);
        iVar4 = snprintf_error_cnt(buf_00,CONCAT44(in_stack_ffffffffffffffb4,
                                                   in_stack_ffffffffffffffb0),
                                   in_stack_ffffffffffffffa8);
        local_38 = iVar4 + iVar3 + local_38;
      }
      local_4 = local_38;
    }
    else {
      fprintf(_stderr,"Error class %#x is invalid\n",(ulong)uVar1);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int snprintf_can_error_frame(char *buf, size_t len, const struct canfd_frame *cf,
                  const char* sep)
{
	canid_t class, mask;
	int i, n = 0, classes = 0;
	char *defsep = ",";

	if (!(cf->can_id & CAN_ERR_FLAG))
		return 0;

	class = cf->can_id & CAN_EFF_MASK;
	if (class > (1 << ARRAY_SIZE(error_classes))) {
		fprintf(stderr, "Error class %#x is invalid\n", class);
		return 0;
	}

	if (!sep)
		sep = defsep;

	for (i = 0; i < (int)ARRAY_SIZE(error_classes); i++) {
		mask = 1 << i;
		if (class & mask) {
			int tmp_n = 0;
			if (classes) {
				/* Fix for potential buffer overflow https://lgtm.com/rules/1505913226124/ */
				tmp_n = snprintf(buf + n, len - n, "%s", sep);
				if (tmp_n < 0 || (size_t)tmp_n >= len - n) {
					buf[0] = 0; /* empty terminated string */
					return 0;
				}
				n += tmp_n;
			}
			tmp_n = snprintf(buf + n, len - n, "%s", error_classes[i]);
			if (tmp_n < 0 || (size_t)tmp_n >= len - n) {
				buf[0] = 0; /* empty terminated string */
				return 0;
			}
			n += tmp_n;
			if (mask == CAN_ERR_LOSTARB)
				n += snprintf_error_lostarb(buf + n, len - n,
							   cf);
			if (mask == CAN_ERR_CRTL)
				n += snprintf_error_ctrl(buf + n, len - n, cf);
			if (mask == CAN_ERR_PROT)
				n += snprintf_error_prot(buf + n, len - n, cf);
			if (mask == CAN_ERR_CNT)
				n += snprintf_error_cnt(buf + n, len - n, cf);
			classes++;
		}
	}

	if (!(cf->can_id & CAN_ERR_CNT) && (cf->data[6] || cf->data[7])) {
		n += snprintf(buf + n, len - n, "%serror-counter-tx-rx", sep);
		n += snprintf_error_cnt(buf + n, len - n, cf);
	}

	return n;
}